

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O1

void Curl_setup_transfer(Curl_easy *data,int sockindex,curl_off_t size,_Bool getheader,
                        int writesockindex)

{
  int *piVar1;
  uint uVar2;
  connectdata *pcVar3;
  ushort uVar4;
  int iVar5;
  curl_socket_t cVar6;
  curl_socket_t cVar7;
  curltime cVar8;
  
  pcVar3 = data->conn;
  if ((((pcVar3->bits).field_0x7 & 8) == 0) && (pcVar3->httpversion != 0x14)) {
    cVar6 = -1;
    cVar7 = -1;
    if (sockindex != -1) {
      cVar7 = pcVar3->sock[sockindex];
    }
    pcVar3->sockfd = cVar7;
    if (writesockindex != -1) {
      cVar6 = pcVar3->sock[writesockindex];
    }
  }
  else {
    iVar5 = sockindex;
    if ((sockindex == -1) && (iVar5 = writesockindex, writesockindex == -1)) {
      cVar6 = -1;
    }
    else {
      cVar6 = pcVar3->sock[iVar5];
    }
    pcVar3->sockfd = cVar6;
  }
  pcVar3->writesockfd = cVar6;
  uVar4 = (ushort)*(undefined4 *)&(data->req).field_0x570;
  *(ushort *)&(data->req).field_0x570 = uVar4 & 0xff7f | (ushort)getheader << 7;
  (data->req).size = size;
  if ((!getheader) &&
     (*(ushort *)&(data->req).field_0x570 = uVar4 & 0xff7e | (ushort)getheader << 7, 0 < size)) {
    Curl_pgrsSetDownloadSize(data,size);
  }
  if ((((data->req).field_0x570 & 0x80) != 0) || (((data->set).field_0x8eb & 0x10) == 0)) {
    if (sockindex != -1) {
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 1;
    }
    if (writesockindex != -1) {
      uVar2 = *(uint *)&(data->state).field_0x514;
      if ((uVar2 >> 8 & 1) != 0) {
        if (((pcVar3->handler->protocol & 3) != 0) &&
           (*(int *)((long)(data->req).protop + 0x208) == 2)) {
          (data->req).exp100 = EXP100_AWAITING_CONTINUE;
          cVar8 = Curl_now();
          (data->req).start100.tv_sec = cVar8.tv_sec;
          (data->req).start100.tv_usec = cVar8.tv_usec;
          Curl_expire(data,(data->set).expect_100_timeout,EXPIRE_100_TIMEOUT);
          return;
        }
        if ((uVar2 >> 8 & 1) != 0) {
          (data->req).exp100 = EXP100_SENDING_REQUEST;
        }
      }
      piVar1 = &(data->req).keepon;
      *(byte *)piVar1 = (byte)*piVar1 | 2;
    }
  }
  return;
}

Assistant:

void
Curl_setup_transfer(
  struct Curl_easy *data,   /* transfer */
  int sockindex,            /* socket index to read from or -1 */
  curl_off_t size,          /* -1 if unknown at this point */
  bool getheader,           /* TRUE if header parsing is wanted */
  int writesockindex        /* socket index to write to, it may very well be
                               the same we read from. -1 disables */
  )
{
  struct SingleRequest *k = &data->req;
  struct connectdata *conn = data->conn;
  DEBUGASSERT(conn != NULL);
  DEBUGASSERT((sockindex <= 1) && (sockindex >= -1));

  if(conn->bits.multiplex || conn->httpversion == 20) {
    /* when multiplexing, the read/write sockets need to be the same! */
    conn->sockfd = sockindex == -1 ?
      ((writesockindex == -1 ? CURL_SOCKET_BAD : conn->sock[writesockindex])) :
      conn->sock[sockindex];
    conn->writesockfd = conn->sockfd;
  }
  else {
    conn->sockfd = sockindex == -1 ?
      CURL_SOCKET_BAD : conn->sock[sockindex];
    conn->writesockfd = writesockindex == -1 ?
      CURL_SOCKET_BAD:conn->sock[writesockindex];
  }
  k->getheader = getheader;

  k->size = size;

  /* The code sequence below is placed in this function just because all
     necessary input is not always known in do_complete() as this function may
     be called after that */

  if(!k->getheader) {
    k->header = FALSE;
    if(size > 0)
      Curl_pgrsSetDownloadSize(data, size);
  }
  /* we want header and/or body, if neither then don't do this! */
  if(k->getheader || !data->set.opt_no_body) {

    if(sockindex != -1)
      k->keepon |= KEEP_RECV;

    if(writesockindex != -1) {
      struct HTTP *http = data->req.protop;
      /* HTTP 1.1 magic:

         Even if we require a 100-return code before uploading data, we might
         need to write data before that since the REQUEST may not have been
         finished sent off just yet.

         Thus, we must check if the request has been sent before we set the
         state info where we wait for the 100-return code
      */
      if((data->state.expect100header) &&
         (conn->handler->protocol&PROTO_FAMILY_HTTP) &&
         (http->sending == HTTPSEND_BODY)) {
        /* wait with write until we either got 100-continue or a timeout */
        k->exp100 = EXP100_AWAITING_CONTINUE;
        k->start100 = Curl_now();

        /* Set a timeout for the multi interface. Add the inaccuracy margin so
           that we don't fire slightly too early and get denied to run. */
        Curl_expire(data, data->set.expect_100_timeout, EXPIRE_100_TIMEOUT);
      }
      else {
        if(data->state.expect100header)
          /* when we've sent off the rest of the headers, we must await a
             100-continue but first finish sending the request */
          k->exp100 = EXP100_SENDING_REQUEST;

        /* enable the write bit when we're not waiting for continue */
        k->keepon |= KEEP_SEND;
      }
    } /* if(writesockindex != -1) */
  } /* if(k->getheader || !data->set.opt_no_body) */

}